

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended.hpp
# Opt level: O2

void shrink_to_fit_hplane(IsoHPlane *hplane,bool clear_vectors)

{
  pointer puVar1;
  pointer pCVar2;
  pointer pdVar3;
  pointer piVar4;
  undefined3 in_register_00000031;
  
  if (CONCAT31(in_register_00000031,clear_vectors) != 0) {
    puVar1 = (hplane->col_num).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((hplane->col_num).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar1) {
      (hplane->col_num).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar1;
    }
    pCVar2 = (hplane->col_type).super__Vector_base<ColType,_std::allocator<ColType>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((hplane->col_type).super__Vector_base<ColType,_std::allocator<ColType>_>._M_impl.
        super__Vector_impl_data._M_finish != pCVar2) {
      (hplane->col_type).super__Vector_base<ColType,_std::allocator<ColType>_>._M_impl.
      super__Vector_impl_data._M_finish = pCVar2;
    }
    pdVar3 = (hplane->coef).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((hplane->coef).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != pdVar3) {
      (hplane->coef).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = pdVar3;
    }
    pdVar3 = (hplane->mean).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((hplane->mean).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != pdVar3) {
      (hplane->mean).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = pdVar3;
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::clear(&hplane->cat_coef);
    piVar4 = (hplane->chosen_cat).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((hplane->chosen_cat).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar4) {
      (hplane->chosen_cat).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar4;
    }
    pdVar3 = (hplane->fill_val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((hplane->fill_val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != pdVar3) {
      (hplane->fill_val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = pdVar3;
    }
    pdVar3 = (hplane->fill_new).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((hplane->fill_new).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != pdVar3) {
      (hplane->fill_new).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = pdVar3;
    }
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_shrink_to_fit(&hplane->col_num);
  std::vector<ColType,_std::allocator<ColType>_>::_M_shrink_to_fit(&hplane->col_type);
  std::vector<double,_std::allocator<double>_>::_M_shrink_to_fit(&hplane->coef);
  std::vector<double,_std::allocator<double>_>::_M_shrink_to_fit(&hplane->mean);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::_M_shrink_to_fit(&hplane->cat_coef);
  std::vector<int,_std::allocator<int>_>::_M_shrink_to_fit(&hplane->chosen_cat);
  std::vector<double,_std::allocator<double>_>::_M_shrink_to_fit(&hplane->fill_val);
  std::vector<double,_std::allocator<double>_>::_M_shrink_to_fit(&hplane->fill_new);
  return;
}

Assistant:

void shrink_to_fit_hplane(IsoHPlane &hplane, bool clear_vectors)
{
    if (clear_vectors)
    {
        hplane.col_num.clear();
        hplane.col_type.clear();
        hplane.coef.clear();
        hplane.mean.clear();
        hplane.cat_coef.clear();
        hplane.chosen_cat.clear();
        hplane.fill_val.clear();
        hplane.fill_new.clear();
    }

    hplane.col_num.shrink_to_fit();
    hplane.col_type.shrink_to_fit();
    hplane.coef.shrink_to_fit();
    hplane.mean.shrink_to_fit();
    hplane.cat_coef.shrink_to_fit();
    hplane.chosen_cat.shrink_to_fit();
    hplane.fill_val.shrink_to_fit();
    hplane.fill_new.shrink_to_fit();
}